

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O3

string * __thiscall
embree::BVHNStatistics<8>::Statistics::NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<8>,8>>::
toString_abi_cxx11_(string *__return_storage_ptr__,void *this,BVH *bvh,double sahTotal,
                   size_t bytesTotal)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ostringstream stream;
  long local_1a0;
  undefined8 local_198 [2];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"sah = ",6);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 7;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 3;
  auVar6 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds0.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds0.lower.field_0);
  auVar4 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds1.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds1.lower.field_0);
  auVar3 = vblendps_avx(auVar6,ZEXT816(0) << 0x40,8);
  auVar5 = vshufps_avx(auVar3,auVar3,0xc9);
  auVar4 = vblendps_avx(auVar4,ZEXT816(0) << 0x40,8);
  auVar2 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar3 = vsubps_avx(auVar4,auVar3);
  auVar4 = vsubps_avx(auVar2,auVar5);
  auVar7._0_4_ = auVar3._0_4_ * auVar4._0_4_ * 0.33333334 +
                 auVar6._0_4_ * auVar5._0_4_ +
                 (auVar6._0_4_ * auVar4._0_4_ + auVar5._0_4_ * auVar3._0_4_) * 0.5;
  auVar7._4_4_ = auVar3._4_4_ * auVar4._4_4_ * 0.33333334 +
                 auVar6._4_4_ * auVar5._4_4_ +
                 (auVar6._4_4_ * auVar4._4_4_ + auVar5._4_4_ * auVar3._4_4_) * 0.5;
  auVar7._8_4_ = auVar3._8_4_ * auVar4._8_4_ * 0.33333334 +
                 auVar6._8_4_ * auVar5._8_4_ +
                 (auVar6._8_4_ * auVar4._8_4_ + auVar5._8_4_ * auVar3._8_4_) * 0.5;
  auVar7._12_4_ =
       auVar3._12_4_ * auVar4._12_4_ * 0.33333334 +
       auVar6._12_4_ * auVar5._12_4_ +
       (auVar6._12_4_ * auVar4._12_4_ + auVar5._12_4_ * auVar3._12_4_) * 0.5;
  auVar3 = vhaddps_avx(auVar7,auVar7);
  auVar4 = vshufpd_avx(auVar7,auVar7,1);
  std::ostream::_M_insert<double>(*this / (double)(auVar4._0_4_ + auVar3._0_4_));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," (",2);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  auVar6 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds0.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds0.lower.field_0);
  auVar4 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds1.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds1.lower.field_0);
  auVar3 = vblendps_avx(auVar6,ZEXT816(0) << 0x40,8);
  auVar5 = vshufps_avx(auVar3,auVar3,0xc9);
  auVar4 = vblendps_avx(auVar4,ZEXT816(0) << 0x40,8);
  auVar2 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar3 = vsubps_avx(auVar4,auVar3);
  auVar4 = vsubps_avx(auVar2,auVar5);
  auVar2._0_4_ = auVar3._0_4_ * auVar4._0_4_ * 0.33333334 +
                 auVar6._0_4_ * auVar5._0_4_ +
                 (auVar6._0_4_ * auVar4._0_4_ + auVar5._0_4_ * auVar3._0_4_) * 0.5;
  auVar2._4_4_ = auVar3._4_4_ * auVar4._4_4_ * 0.33333334 +
                 auVar6._4_4_ * auVar5._4_4_ +
                 (auVar6._4_4_ * auVar4._4_4_ + auVar5._4_4_ * auVar3._4_4_) * 0.5;
  auVar2._8_4_ = auVar3._8_4_ * auVar4._8_4_ * 0.33333334 +
                 auVar6._8_4_ * auVar5._8_4_ +
                 (auVar6._8_4_ * auVar4._8_4_ + auVar5._8_4_ * auVar3._8_4_) * 0.5;
  auVar2._12_4_ =
       auVar3._12_4_ * auVar4._12_4_ * 0.33333334 +
       auVar6._12_4_ * auVar5._12_4_ +
       (auVar6._12_4_ * auVar4._12_4_ + auVar5._12_4_ * auVar3._12_4_) * 0.5;
  auVar3 = vhaddps_avx(auVar2,auVar2);
  auVar4 = vshufpd_avx(auVar2,auVar2,1);
  poVar1 = std::ostream::_M_insert<double>
                     (((*this / (double)(auVar4._0_4_ + auVar3._0_4_)) * 100.0) / sahTotal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%), ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"#bytes = ",9);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 7;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(long *)((long)this + 8) * 0x88;
  auVar3 = vpunpckldq_avx(auVar3,_DAT_01f7bac0);
  auVar3 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  poVar1 = std::ostream::_M_insert<double>((auVar3._0_8_ + auVar3._8_8_) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," MB ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"(",1);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(long *)((long)this + 8) * 0x88;
  auVar3 = vpunpckldq_avx(auVar4,ZEXT816(0x4530000043300000));
  auVar4 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = bytesTotal;
  auVar3 = vpunpckldq_avx(auVar8,ZEXT816(0x4530000043300000));
  auVar3 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  poVar1 = std::ostream::_M_insert<double>
                     (((auVar4._0_8_ + auVar4._8_8_) * 100.0) / (auVar3._0_8_ + auVar3._8_8_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%), ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"#nodes = ",9);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 7;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)((long)this + 0x10);
  auVar3 = vunpcklps_avx(auVar5,ZEXT816(0x4530000043300000));
  auVar4 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(long *)((long)this + 8) << 3;
  auVar3 = vpunpckldq_avx(auVar9,ZEXT816(0x4530000043300000));
  auVar3 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  poVar1 = std::ostream::_M_insert<double>
                     (((auVar4._0_8_ + auVar4._8_8_) / (auVar3._0_8_ + auVar3._8_8_)) * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"% filled), ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"#bytes/prim = ",0xe);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(long *)((long)this + 8) * 0x88;
  auVar3 = vpunpckldq_avx(auVar6,ZEXT816(0x4530000043300000));
  auVar4 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = bvh->numPrimitives;
  auVar3 = vpunpckldq_avx(auVar10,ZEXT816(0x4530000043300000));
  auVar3 = vsubpd_avx(auVar3,_DAT_01f7bad0);
  std::ostream::_M_insert<double>((auVar4._0_8_ + auVar4._8_8_) / (auVar3._0_8_ + auVar3._8_8_));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(BVH* bvh, double sahTotal, size_t bytesTotal) const
        {
          std::ostringstream stream;
          stream.setf(std::ios::fixed, std::ios::floatfield);
          stream << "sah = " << std::setw(7) << std::setprecision(3) << sah(bvh);
          stream << " (" << std::setw(6) << std::setprecision(2) << 100.0*sah(bvh)/sahTotal << "%), ";          
          stream << "#bytes = " << std::setw(7) << std::setprecision(2) << bytes()/1E6  << " MB ";
          stream << "(" << std::setw(6) << std::setprecision(2) << 100.0*double(bytes())/double(bytesTotal) << "%), ";
          stream << "#nodes = " << std::setw(7) << numNodes << " (" << std::setw(6) << std::setprecision(2) << 100.0*fillRate() << "% filled), ";
          stream << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(bytes())/double(bvh->numPrimitives);
          return stream.str();
        }